

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint bit,Adaptive_Bit_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (this->length >> 0xd) * M->bit_0_prob;
  if (bit == 0) {
    this->length = uVar4;
    M->bit_0_count = M->bit_0_count + 1;
  }
  else {
    uVar3 = this->length - uVar4;
    puVar1 = &this->base;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar4;
    this->length = uVar3;
    if (!CARRY4(uVar2,uVar4)) goto LAB_00399cf9;
    propagate_carry(this);
  }
  uVar3 = this->length;
LAB_00399cf9:
  if (uVar3 < 0x1000000) {
    renorm_enc_interval(this);
  }
  puVar1 = &M->bits_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  Adaptive_Bit_Model::update(M);
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned bit,
                                  Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        unsigned init_base = base;
        base   += x;
        length -= x;
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update
    }